

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

Movement StrToMovement(string *move)

{
  Movement MVar1;
  int iVar2;
  char *pcVar3;
  ulong in_RDI;
  int to;
  int from;
  string s;
  Movement movement;
  allocator *move_00;
  string local_98 [36];
  int local_74;
  string local_70 [32];
  int local_50;
  allocator local_39;
  string local_38 [44];
  undefined1 local_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined5 uStack_9;
  undefined4 local_4;
  
  move_00 = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",move_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
  std::__cxx11::string::operator+=(local_38,*pcVar3);
  pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
  std::__cxx11::string::operator+=(local_38,*pcVar3);
  std::__cxx11::string::string(local_70,local_38);
  iVar2 = StrToInt((string *)move_00);
  std::__cxx11::string::~string(local_70);
  local_50 = iVar2;
  std::__cxx11::string::operator=(local_38,"");
  pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
  std::__cxx11::string::operator+=(local_38,*pcVar3);
  pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
  std::__cxx11::string::operator+=(local_38,*pcVar3);
  std::__cxx11::string::string(local_98,local_38);
  iVar2 = StrToInt((string *)move_00);
  std::__cxx11::string::~string(local_98);
  local_c = (undefined1)local_50;
  local_74._0_1_ = (undefined1)iVar2;
  uStack_b = (undefined1)local_74;
  uStack_a = 0;
  local_74 = iVar2;
  std::__cxx11::string::~string(local_38);
  MVar1.to = uStack_b;
  MVar1.from = local_c;
  MVar1.capture = uStack_a;
  MVar1._3_5_ = uStack_9;
  MVar1.catc = (undefined1)local_4;
  MVar1.movec = local_4._1_1_;
  MVar1._10_2_ = local_4._2_2_;
  return MVar1;
}

Assistant:

Movement  StrToMovement(const std::string move) {
	std::string s = "";
	s += move[0]; 
    s += move[1];
	int from = StrToInt (s);
	s = ""; 
    s += move[2]; 
    s += move[3];
	int to = StrToInt (s);
    Movement movement;
    movement.from = from;
    movement.to = to;
    movement.capture = 0;
	return movement;
}